

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O3

void jpeg_fdct_5x10(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  JSAMPROW pJVar5;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  DCTELEM *pDVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  DCTELEM workspace [16];
  int local_78 [8];
  int aiStack_58 [10];
  
  lVar21 = 0;
  memset(data,0,0x100);
  uVar7 = (ulong)start_col;
  pDVar10 = data;
  do {
    pJVar5 = sample_data[lVar21];
    uVar18 = (ulong)((uint)pJVar5[uVar7] + (uint)pJVar5[uVar7 + 4]);
    uVar9 = (ulong)((uint)pJVar5[uVar7 + 1] + (uint)pJVar5[uVar7 + 3]);
    bVar1 = pJVar5[uVar7 + 2];
    lVar8 = uVar18 + uVar9;
    lVar11 = (ulong)pJVar5[uVar7] - (ulong)pJVar5[uVar7 + 4];
    lVar13 = (ulong)pJVar5[uVar7 + 1] - (ulong)pJVar5[uVar7 + 3];
    *pDVar10 = ((int)lVar8 + (uint)bVar1) * 4 + -0xa00;
    lVar16 = (uVar18 - uVar9) * 0x194c;
    lVar8 = lVar8 + (ulong)bVar1 * -4;
    pDVar10[2] = (int)(lVar16 + lVar8 * 0xb50 + 0x400U >> 0xb);
    pDVar10[4] = (int)((ulong)(lVar16 + 0x400 + lVar8 * -0xb50) >> 0xb);
    lVar8 = (lVar13 + lVar11) * 0x1a9a;
    pDVar10[1] = (int)(lVar11 * 0x1071 + lVar8 + 0x400U >> 0xb);
    pDVar10[3] = (int)(lVar8 + lVar13 * 0x7ffffffba5c + 0x400U >> 0xb);
    piVar6 = local_78;
    if ((int)lVar21 != 7) {
      if ((int)lVar21 == 9) {
        lVar21 = 0;
        do {
          iVar2 = local_78[lVar21];
          iVar3 = aiStack_58[lVar21];
          iVar4 = data[lVar21];
          lVar12 = (long)(iVar3 + iVar4);
          lVar16 = (long)(iVar2 + data[lVar21 + 8]);
          lVar13 = (long)(data[lVar21 + 0x30] + data[lVar21 + 0x18]);
          lVar11 = (long)(data[lVar21 + 0x28] + data[lVar21 + 0x20]);
          lVar8 = lVar11 + lVar12;
          lVar12 = lVar12 - lVar11;
          lVar11 = lVar16 + lVar13;
          lVar16 = lVar16 - lVar13;
          lVar13 = (long)(data[lVar21 + 0x38] + data[lVar21 + 0x10]);
          data[lVar21] = (DCTELEM)((lVar11 + lVar13 + lVar8) * 0x28f6 + 0x4000U >> 0xf);
          lVar14 = (long)(iVar4 - iVar3);
          lVar15 = (long)(data[lVar21 + 8] - iVar2);
          lVar19 = (long)(data[lVar21 + 0x10] - data[lVar21 + 0x38]);
          lVar17 = (long)(data[lVar21 + 0x18] - data[lVar21 + 0x30]);
          lVar20 = (long)(data[lVar21 + 0x20] - data[lVar21 + 0x28]);
          data[lVar21 + 0x20] =
               (DCTELEM)(lVar11 * 0x7fffffffee1a + lVar13 * -0x10000000039ee + lVar8 * 0x2edd +
                         0x4000U >> 0xf);
          lVar8 = (lVar12 + lVar16) * 0x220c;
          data[lVar21 + 0x10] = (DCTELEM)(lVar12 * 0x150b + lVar8 + 0x4000U >> 0xf);
          data[lVar21 + 0x30] = (DCTELEM)(lVar8 + lVar16 * 0x7fffffffa6dc + 0x4000U >> 0xf);
          data[lVar21 + 0x28] =
               (DCTELEM)((((lVar20 + lVar14) - (lVar15 - lVar17)) - lVar19) * 0x28f6 + 0x4000U >>
                        0xf);
          data[lVar21 + 8] =
               (DCTELEM)((ulong)(lVar20 * 0x910 + 0x4000 +
                                lVar17 * 0x1a4c + lVar19 * 0x28f6 +
                                lVar15 * 0x339d + lVar14 * 0x3937) >> 0xf);
          lVar8 = (lVar15 - lVar17) * 0x2123 + lVar19 * -0x28f6 + (lVar20 + lVar14) * 0xca8;
          lVar11 = (lVar17 + lVar15) * -0x1813 + (lVar14 - lVar20) * 0x26f5 + 0x4000;
          data[lVar21 + 0x18] = (DCTELEM)((ulong)(lVar11 + lVar8) >> 0xf);
          data[lVar21 + 0x38] = (DCTELEM)((ulong)(lVar11 - lVar8) >> 0xf);
          lVar21 = lVar21 + 1;
        } while ((int)lVar21 != 5);
        return;
      }
      piVar6 = pDVar10 + 8;
    }
    pDVar10 = piVar6;
    lVar21 = lVar21 + 1;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_fdct_5x10 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14;
  DCTELEM workspace[8*2];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* 5-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/10). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[4]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[3]);
    tmp2 = GETJSAMPLE(elemptr[2]);

    tmp10 = tmp0 + tmp1;
    tmp11 = tmp0 - tmp1;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[4]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[3]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp2 - 5 * CENTERJSAMPLE) << PASS1_BITS);
    tmp11 = MULTIPLY(tmp11, FIX(0.790569415));          /* (c2+c4)/2 */
    tmp10 -= tmp2 << 2;
    tmp10 = MULTIPLY(tmp10, FIX(0.353553391));          /* (c2-c4)/2 */
    dataptr[2] = (DCTELEM) DESCALE(tmp11 + tmp10, CONST_BITS-PASS1_BITS);
    dataptr[4] = (DCTELEM) DESCALE(tmp11 - tmp10, CONST_BITS-PASS1_BITS);

    /* Odd part */

    tmp10 = MULTIPLY(tmp0 + tmp1, FIX(0.831253876));    /* c3 */

    dataptr[1] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp0, FIX(0.513743148)), /* c1-c3 */
	      CONST_BITS-PASS1_BITS);
    dataptr[3] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp1, FIX(2.176250899)), /* c1+c3 */
	      CONST_BITS-PASS1_BITS);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == 10)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/5)*(8/10) = 32/25, which we
   * fold into the constant multipliers:
   * 10-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/20) * 32/25.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = 0; ctr < 5; ctr++) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*1];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*0];
    tmp12 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*7];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*6];
    tmp4 = dataptr[DCTSIZE*4] + dataptr[DCTSIZE*5];

    tmp10 = tmp0 + tmp4;
    tmp13 = tmp0 - tmp4;
    tmp11 = tmp1 + tmp3;
    tmp14 = tmp1 - tmp3;

    tmp0 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*1];
    tmp1 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*0];
    tmp2 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*7];
    tmp3 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*6];
    tmp4 = dataptr[DCTSIZE*4] - dataptr[DCTSIZE*5];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp11 + tmp12, FIX(1.28)), /* 32/25 */
	      CONST_BITS+PASS1_BITS);
    tmp12 += tmp12;
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp12, FIX(1.464477191)) - /* c4 */
	      MULTIPLY(tmp11 - tmp12, FIX(0.559380511)),  /* c8 */
	      CONST_BITS+PASS1_BITS);
    tmp10 = MULTIPLY(tmp13 + tmp14, FIX(1.064004961));    /* c6 */
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp13, FIX(0.657591230)),  /* c2-c6 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(2.785601151)),  /* c2+c6 */
	      CONST_BITS+PASS1_BITS);

    /* Odd part */

    tmp10 = tmp0 + tmp4;
    tmp11 = tmp1 - tmp3;
    dataptr[DCTSIZE*5] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp11 - tmp2, FIX(1.28)),  /* 32/25 */
	      CONST_BITS+PASS1_BITS);
    tmp2 = MULTIPLY(tmp2, FIX(1.28));                     /* 32/25 */
    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0, FIX(1.787906876)) +          /* c1 */
	      MULTIPLY(tmp1, FIX(1.612894094)) + tmp2 +   /* c3 */
	      MULTIPLY(tmp3, FIX(0.821810588)) +          /* c7 */
	      MULTIPLY(tmp4, FIX(0.283176630)),           /* c9 */
	      CONST_BITS+PASS1_BITS);
    tmp12 = MULTIPLY(tmp0 - tmp4, FIX(1.217352341)) -     /* (c3+c7)/2 */
	    MULTIPLY(tmp1 + tmp3, FIX(0.752365123));      /* (c1-c9)/2 */
    tmp13 = MULTIPLY(tmp10 + tmp11, FIX(0.395541753)) +   /* (c3-c7)/2 */
	    MULTIPLY(tmp11, FIX(0.64)) - tmp2;            /* 16/25 */
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp12 + tmp13, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp12 - tmp13, CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}